

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

bool __thiscall
cmArgumentParser<(anonymous_namespace)::HandleTargetsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
::Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (cmArgumentParser<(anonymous_namespace)::HandleTargetsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
           *this,ArgVectors *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unparsedArguments,size_t pos)

{
  bool local_c2;
  undefined1 local_a0 [8];
  Instance instance;
  ParseResult *parseResultPtr;
  size_t pos_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unparsedArguments_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  ArgVectors *result_local;
  cmArgumentParser<ArgVectors> *this_local;
  
  instance._96_8_ =
       ArgumentParser::
       AsParseResultPtr<(anonymous_namespace)::HandleTargetsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                 (result);
  ArgumentParser::Instance::Instance
            ((Instance *)local_a0,(ActionMap *)this,(ParseResult *)instance._96_8_,unparsedArguments
             ,result);
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)local_a0,args,pos);
  if (instance._96_8_ == 0) {
    local_c2 = true;
  }
  else {
    local_c2 = ArgumentParser::ParseResult::operator_cast_to_bool((ParseResult *)instance._96_8_);
  }
  ArgumentParser::Instance::~Instance((Instance *)local_a0);
  return local_c2;
}

Assistant:

bool Parse(Result& result, Range const& args,
             std::vector<std::string>* unparsedArguments,
             std::size_t pos = 0) const
  {
    using ArgumentParser::AsParseResultPtr;
    ParseResult* parseResultPtr = AsParseResultPtr(result);
    Instance instance(this->Bindings, parseResultPtr, unparsedArguments,
                      &result);
    instance.Parse(args, pos);
    return parseResultPtr ? static_cast<bool>(*parseResultPtr) : true;
  }